

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O3

bool __thiscall
el::Configurations::hasConfiguration
          (Configurations *this,Level level,ConfigurationType configurationType)

{
  Configuration *pCVar1;
  Level local_1c;
  
  local_1c = level;
  (*(this->super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>).
    super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
    .super_ThreadSafe._vptr_ThreadSafe[2])();
  pCVar1 = base::utils::RegistryWithPred<el::Configuration,el::Configuration::Predicate>::
           get<el::Level,el::ConfigurationType>
                     ((RegistryWithPred<el::Configuration,el::Configuration::Predicate> *)this,
                      &local_1c,configurationType);
  return pCVar1 != (Configuration *)0x0;
}

Assistant:

bool Configurations::hasConfiguration(Level level, ConfigurationType configurationType) {
  base::threading::ScopedLock scopedLock(lock());
#if ELPP_COMPILER_INTEL
  // We cant specify template types here, Intel C++ throws compilation error
  // "error: type name is not allowed"
  return RegistryWithPred::get(level, configurationType) != nullptr;
#else
  return RegistryWithPred<Configuration, Configuration::Predicate>::get(level, configurationType) != nullptr;
#endif  // ELPP_COMPILER_INTEL
}